

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O2

bool Cipher::normalizeSimilarityMap
               (TParameters *param_1,TSimilarityMap *ccMap,TSimilarityMap *logMap,
               TSimilarityMap *logMapInv)

{
  double dVar1;
  pointer pvVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  
  pvVar2 = (ccMap->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(ccMap->
                 super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) / 0x18;
  iVar13 = (int)uVar6;
  uVar7 = uVar6 & 0xffffffff;
  iVar4 = 1;
  if (1 < iVar13) {
    iVar4 = iVar13;
  }
  dVar14 = 2.2250738585072014e-308;
  dVar15 = 1.79769313486232e+308;
  uVar8 = 1;
  lVar9 = 0x10;
  for (uVar10 = 0; uVar10 != iVar4 - 1; uVar10 = uVar10 + 1) {
    lVar11 = lVar9;
    for (uVar12 = uVar7; uVar8 != uVar12; uVar12 = uVar12 - 1) {
      dVar1 = *(double *)
               (*(long *)&pvVar2[uVar10].super__Vector_base<stMatch,_std::allocator<stMatch>_>.
                          _M_impl.super__Vector_impl_data + lVar11);
      dVar5 = dVar1;
      if (dVar15 <= dVar1) {
        dVar5 = dVar15;
      }
      dVar15 = dVar5;
      if (dVar1 <= dVar14) {
        dVar1 = dVar14;
      }
      dVar14 = dVar1;
      lVar11 = lVar11 + 0x10;
    }
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x10;
  }
  printf("ccMax = %g, ccMin = %g\n");
  lVar9 = 0;
  if (iVar13 < 1) {
    uVar7 = 0;
  }
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    pvVar2 = (ccMap->
             super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (lVar11 = 0; (uVar6 & 0xffffffff) << 4 != lVar11; lVar11 = lVar11 + 0x10) {
      lVar3 = *(long *)&pvVar2[uVar8].super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                        super__Vector_impl_data;
      if (lVar9 == lVar11) {
        *(undefined8 *)(lVar3 + uVar8 * 0x10) = 0x3ff0000000000000;
      }
      else {
        *(double *)(lVar3 + lVar11) =
             (*(double *)(lVar3 + lVar11) - (dVar15 + -1e-06)) /
             ((dVar14 + 1e-06) - (dVar15 + -1e-06));
      }
    }
    lVar9 = lVar9 + 0x10;
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMap,ccMap);
  lVar9 = 0;
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    for (lVar11 = 0; (uVar6 & 0xffffffff) << 4 != lVar11; lVar11 = lVar11 + 0x10) {
      lVar3 = *(long *)&(logMap->
                        super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar8].
                        super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                        super__Vector_impl_data;
      if (lVar9 == lVar11) {
        *(undefined8 *)(lVar3 + uVar8 * 0x10) = 0;
      }
      else {
        dVar14 = log(*(double *)(lVar3 + lVar11));
        *(double *)(lVar3 + lVar11) = dVar14;
      }
    }
    lVar9 = lVar9 + 0x10;
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMapInv,ccMap);
  lVar9 = 0;
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    for (lVar11 = 0; (uVar6 & 0xffffffff) << 4 != lVar11; lVar11 = lVar11 + 0x10) {
      if (lVar9 == lVar11) {
        *(undefined8 *)
         (*(long *)&(logMap->
                    super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar8].
                    super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                    super__Vector_impl_data + uVar8 * 0x10) = 0xc12e848000000000;
      }
      else {
        lVar3 = *(long *)&(logMapInv->
                          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                          super__Vector_impl_data;
        dVar14 = log(1.0 - *(double *)(lVar3 + lVar11));
        *(double *)(lVar3 + lVar11) = dVar14;
      }
    }
    lVar9 = lVar9 + 0x10;
  }
  return true;
}

Assistant:

bool normalizeSimilarityMap(
            const TParameters & ,
            TSimilarityMap & ccMap,
            TSimilarityMap & logMap,
            TSimilarityMap & logMapInv) {
        int n = ccMap.size();

        double ccMin = std::numeric_limits<double>::max();
        double ccMax = std::numeric_limits<double>::min();

        for (int j = 0; j < n - 1; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccMin = std::min(ccMin, ccMap[j][i].cc);
                ccMax = std::max(ccMax, ccMap[j][i].cc);
            }
        }

        ccMin -= 1e-6;
        ccMax += 1e-6;

        printf("ccMax = %g, ccMin = %g\n", ccMax, ccMin);

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    ccMap[j][i].cc = 1.0;
                    continue;
                }

                auto & v = ccMap[j][i].cc;
                v = (v - ccMin)/(ccMax - ccMin);
                //v = 1.0 - std::exp(-1.1f*v);
            }
        }

        logMap = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = 0.0;
                    continue;
                }

                auto & v = logMap[j][i].cc;
                v = std::log(v);
            }
        }

        logMapInv = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = -1e6;
                    continue;
                }

                auto & v = logMapInv[j][i].cc;
                v = std::log(1.0 - v);
            }
        }

        return true;
    }